

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O0

void __thiscall AddressFactory_Constructor_Test::TestBody(AddressFactory_Constructor_Test *this)

{
  bool bVar1;
  AddressFactory factory;
  AssertHelper local_58;
  Message local_50 [2];
  AddressFactory local_40;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory(&local_40);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x17fbdf);
    }
  }
  else {
    testing::Message::Message(local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x26,
               "Expected: AddressFactory factory doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message((Message *)0x17fc64);
  }
  return;
}

Assistant:

TEST(AddressFactory, Constructor)
{
  EXPECT_NO_THROW(AddressFactory factory);
}